

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O2

float rsg::DeclarationStatement::getWeight(GeneratorState *state)

{
  Variable *pVVar1;
  bool bVar2;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *pvVar3;
  pointer ppVVar4;
  float fVar5;
  
  pvVar3 = VariableManager::getLiveVariables(state->m_varManager);
  ppVVar4 = (pvVar3->super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppVVar4 ==
        (pvVar3->super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      return 0.0;
    }
    pVVar1 = *ppVVar4;
    ppVVar4 = ppVVar4 + 1;
  } while (pVVar1->m_storage != STORAGE_LOCAL);
  bVar2 = anon_unknown_0::isCurrentTopStatementBlock(state);
  fVar5 = 0.0;
  if (bVar2) {
    fVar5 = (float)(int)state->m_programParams->declarationStatementBaseWeight;
  }
  return fVar5;
}

Assistant:

float DeclarationStatement::getWeight (const GeneratorState& state)
{
	if (!hasDeclarableVars(state.getVariableManager()))
		return 0.0f;

	if (!isCurrentTopStatementBlock(state))
		return 0.0f;

	return state.getProgramParameters().declarationStatementBaseWeight;
}